

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSet::containsNone(UnicodeSet *this,UnicodeString *s)

{
  short sVar1;
  int32_t iVar2;
  char16_t *s_00;
  int iVar3;
  
  s_00 = UnicodeString::getBuffer(s);
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  iVar2 = span(this,s_00,iVar2,USET_SPAN_NOT_CONTAINED);
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  return iVar2 == iVar3;
}

Assistant:

UBool UnicodeSet::containsNone(const UnicodeString& s) const {
    return (UBool)(span(s.getBuffer(), s.length(), USET_SPAN_NOT_CONTAINED) ==
                   s.length());
}